

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_random.c
# Opt level: O2

int archive_random(void *buf,size_t nbytes)

{
  int iVar1;
  bool bVar2;
  uint8_t uVar3;
  __pid_t _Var4;
  u_char *buf_1;
  
  _Var4 = getpid();
  if (((arc4_count < 1) || ((rs_initialized & 1) == 0)) || (arc4_stir_pid != _Var4)) {
    arc4_stir_pid = _Var4;
    arc4_stir();
  }
  while (nbytes != 0) {
    iVar1 = arc4_count + -1;
    bVar2 = arc4_count < 2;
    arc4_count = iVar1;
    if (bVar2) {
      arc4_stir();
    }
    uVar3 = arc4_getbyte();
    *(uint8_t *)((long)buf + (nbytes - 1)) = uVar3;
    nbytes = nbytes - 1;
  }
  return 0;
}

Assistant:

int
archive_random(void *buf, size_t nbytes)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	HCRYPTPROV hProv;
	BOOL success;

	success = CryptAcquireContext(&hProv, NULL, NULL, PROV_RSA_FULL,
	    CRYPT_VERIFYCONTEXT);
	if (!success && GetLastError() == NTE_BAD_KEYSET) {
		success = CryptAcquireContext(&hProv, NULL, NULL,
		    PROV_RSA_FULL, CRYPT_NEWKEYSET);
	}
	if (success) {
		success = CryptGenRandom(hProv, (DWORD)nbytes, (BYTE*)buf);
		CryptReleaseContext(hProv, 0);
		if (success)
			return ARCHIVE_OK;
	}
	/* TODO: Does this case really happen? */
	return ARCHIVE_FAILED;
#else
	arc4random_buf(buf, nbytes);
	return ARCHIVE_OK;
#endif
}